

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_digestMD5(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  vm_obj_id_t obj;
  vm_val_t *pvVar3;
  long lVar4;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjFile *in_RDI;
  char hash [33];
  long len;
  uint argc;
  unsigned_long in_stack_000003e0;
  CVmDataSource *in_stack_000003e8;
  char *in_stack_000003f0;
  undefined4 in_stack_ffffffffffffff58;
  vm_obj_id_t in_stack_ffffffffffffff5c;
  CVmRun *in_stack_ffffffffffffff60;
  undefined1 *bytelen;
  vm_val_t *in_stack_ffffffffffffff68;
  int local_84;
  undefined1 local_78 [48];
  long local_48;
  int local_2c;
  vm_val_t *local_20;
  
  if (in_RCX == (int *)0x0) {
    local_84 = 0;
  }
  else {
    local_84 = *in_RCX;
  }
  local_2c = local_84;
  local_20 = in_RDX;
  if ((getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_digestMD5::desc,0,1);
    __cxa_guard_release(&getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff68,(uint *)in_stack_ffffffffffffff60,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (iVar1 == 0) {
    check_raw_read((CVmObjFile *)in_stack_ffffffffffffff60);
    if ((local_2c == 0) || (pvVar3 = CVmStack::get(0), pvVar3->typ == VM_NIL)) {
      lVar4 = get_file_size((CVmObjFile *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    else {
      CVmStack::get(0);
      iVar2 = vm_val_t::num_to_int((vm_val_t *)in_stack_ffffffffffffff60);
      lVar4 = (long)iVar2;
    }
    local_48 = lVar4;
    CVmRun::push_obj(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    iVar1 = (int)((ulong)lVar4 >> 0x20);
    bytelen = local_78;
    get_ext(in_RDI);
    md5_datasrc(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0);
    obj = CVmObjString::create(iVar1,(char *)local_20,(size_t)bytelen);
    vm_val_t::set_obj(local_20,obj);
    CVmStack::discard(local_2c + 1);
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_digestMD5(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check that the it's a valid file open with read access in "raw" mode */
    check_raw_read(vmg0_);

    /* retrieve the length value, if present; if not, use the file size */
    long len = (argc >= 1 && G_stk->get(0)->typ != VM_NIL
                ? G_stk->get(0)->num_to_int(vmg0_)
                : get_file_size(vmg0_));

    /* save 'self' for gc protection */
    G_stk->push_obj(vmg_ self);

    /* calculate the hash */
    char hash[33];
    md5_datasrc(hash, get_ext()->fp, len);

    /* return the hash value */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, hash, 32));

    /* discard our gc protection and our arguments */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}